

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_rectangles.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  undefined1 auStack_2cf68 [3832];
  undefined8 uStack_2c070;
  undefined1 auStack_2c068 [86016];
  undefined1 auStack_17068 [94216];
  undefined1 *local_60;
  string arg;
  allocator local_31;
  
  arg.field_2._8_8_ = argv;
  if (0 < argc) {
    iVar6 = 0;
    do {
      std::__cxx11::string::string
                ((string *)&local_60,*(char **)(arg.field_2._8_8_ + (long)iVar6 * 8),&local_31);
      iVar5 = iVar6 + 1;
      if ((iVar5 < argc) && (iVar1 = std::__cxx11::string::compare((char *)&local_60), iVar1 == 0))
      {
        nodeCount = atoi(*(char **)(arg.field_2._8_8_ + (long)iVar5 * 8));
        iVar6 = iVar5;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_60);
        if (iVar5 == 0) {
          interleaved = 1;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_60);
          if (iVar5 == 0) {
            textured = 1;
          }
        }
      }
      if ((size_type *)local_60 != &arg._M_string_length) {
        operator_delete(local_60);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < argc);
  }
  if (interleaved != 0) {
    textured = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Using ",6);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,nodeCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes...",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  --interleaved ....: ",0x16);
  pcVar4 = "no";
  pcVar3 = "no";
  if ((ulong)interleaved != 0) {
    pcVar3 = "yes";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar3,(ulong)interleaved | 2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  --textured .......: ",0x16);
  if ((ulong)textured != 0) {
    pcVar4 = "yes";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar4,(ulong)textured | 2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  rengine::AllocationPool<rengine::RectangleNode>::setMemory
            (&rengine::RectangleNode::__allocation_pool_rengine_RectangleNode,auStack_17068,0x400);
  uStack_2c070 = 0x112d14;
  rengine::AllocationPool<rengine::TextureNode>::setMemory
            (&rengine::TextureNode::__allocation_pool_rengine_TextureNode,auStack_2c068,0x400);
  rengine::AllocationPool<rengine::Node>::setMemory
            (&rengine::Node::__allocation_pool_rengine_Node,auStack_2cf68,0x40);
  rengine::rengine_main<Rectangles>(argc,(char **)arg.field_2._8_8_);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    for (int i=0; i<argc; ++i) {
        std::string arg(argv[i]);
        if (i + 1 < argc && arg == "--count") {
            nodeCount = atoi(argv[++i]);
        } else if (i < argc && arg == "--interleaved") {
            interleaved = true;
        } else if (i < argc && arg == "--textured") {
            textured = true;
        }
    }

    if (interleaved)
        textured = false;

    std::cout << "Using " << nodeCount << " nodes..." << std::endl;
    std::cout << "  --interleaved ....: " << (interleaved ? "yes" : "no") << std::endl;
    std::cout << "  --textured .......: " << (textured ? "yes" : "no") << std::endl;

    RENGINE_ALLOCATION_POOL(RectangleNode, rengine_RectangleNode, 1024);
    RENGINE_ALLOCATION_POOL(TextureNode, rengine_TextureNode, 1024);
    RENGINE_ALLOCATION_POOL(Node, rengine_Node, 64);
    rengine_main<Rectangles>(argc, argv);
    return 0;
}